

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alprd.hpp
# Opt level: O0

double duckdb::alp::AlpRDCompression<float,_true>::FindBestDictionary
                 (vector<unsigned_int,_true> *values,State *state)

{
  int iVar1;
  double dVar2;
  double estimated_size;
  double estimated_size_1;
  uint8_t candidate_right_bit_width;
  idx_t i;
  double best_dict_size;
  uint8_t right_bit_width;
  State *in_stack_000000d0;
  uint8_t in_stack_000000df;
  vector<unsigned_int,_true> *in_stack_000000e0;
  State *in_stack_00000150;
  uint8_t in_stack_0000015f;
  vector<unsigned_int,_true> *in_stack_00000160;
  undefined8 local_28;
  undefined8 local_20;
  
  iVar1 = NumericLimits<int>::Maximum();
  local_20 = (double)iVar1;
  for (local_28 = 1; local_28 < 0x11; local_28 = local_28 + 1) {
    UnsafeNumericCast<unsigned_char,unsigned_long,void>(0x20 - local_28);
    dVar2 = BuildLeftPartsDictionary<false>(in_stack_000000e0,in_stack_000000df,in_stack_000000d0);
    if (dVar2 <= local_20) {
      local_20 = dVar2;
    }
  }
  dVar2 = BuildLeftPartsDictionary<true>(in_stack_00000160,in_stack_0000015f,in_stack_00000150);
  return dVar2;
}

Assistant:

static double FindBestDictionary(const vector<EXACT_TYPE> &values, State &state) {
		uint8_t right_bit_width = 0;
		double best_dict_size = NumericLimits<int32_t>::Maximum();
		//! Finding the best position to CUT the values
		for (idx_t i = 1; i <= AlpRDConstants::CUTTING_LIMIT; i++) {
			uint8_t candidate_right_bit_width = UnsafeNumericCast<uint8_t>(EXACT_TYPE_BITSIZE - i);
			double estimated_size = BuildLeftPartsDictionary<false>(values, candidate_right_bit_width, state);
			if (estimated_size <= best_dict_size) {
				right_bit_width = candidate_right_bit_width;
				best_dict_size = estimated_size;
			}
			// TODO: We could implement an early exit mechanism similar to normal ALP
		}
		double estimated_size = BuildLeftPartsDictionary<true>(values, right_bit_width, state);
		return estimated_size;
	}